

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

CURLcode Curl_conncache_add_conn(conncache *connc,connectdata *conn)

{
  Curl_easy *pCVar1;
  conncache *h;
  size_t sVar2;
  long lVar3;
  int iVar4;
  connectbundle *pcVar5;
  connectbundle *cb_ptr;
  curl_llist *pcVar6;
  char *__s;
  size_t key_len;
  void *pvVar7;
  CURLcode CVar8;
  
  pCVar1 = conn->data;
  pcVar5 = Curl_conncache_find_bundle(conn,(pCVar1->state).conn_cache);
  CVar8 = CURLE_OUT_OF_MEMORY;
  if (pcVar5 == (connectbundle *)0x0) {
    cb_ptr = (connectbundle *)(*Curl_cmalloc)(0x18);
    if (cb_ptr == (connectbundle *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    cb_ptr->num_connections = 0;
    cb_ptr->multiuse = 0;
    pcVar6 = Curl_llist_alloc(conn_llist_dtor);
    cb_ptr->conn_list = pcVar6;
    if (pcVar6 == (curl_llist *)0x0) {
      (*Curl_cfree)(cb_ptr);
      return CURLE_OUT_OF_MEMORY;
    }
    __s = hashkey(conn);
    if (__s != (char *)0x0) {
      h = (pCVar1->state).conn_cache;
      key_len = strlen(__s);
      pvVar7 = Curl_hash_add(&h->hash,__s,key_len,cb_ptr);
      (*Curl_cfree)(__s);
      pcVar5 = cb_ptr;
      if (pvVar7 != (void *)0x0) goto LAB_0013f752;
    }
    bundle_destroy(cb_ptr);
  }
  else {
    cb_ptr = (connectbundle *)0x0;
LAB_0013f752:
    iVar4 = Curl_llist_insert_next(pcVar5->conn_list,pcVar5->conn_list->tail,conn);
    if (iVar4 == 0) {
      if (cb_ptr != (connectbundle *)0x0) {
        conncache_remove_bundle((pCVar1->state).conn_cache,cb_ptr);
      }
    }
    else {
      conn->bundle = pcVar5;
      pcVar5->num_connections = pcVar5->num_connections + 1;
      sVar2 = connc->num_connections;
      lVar3 = connc->next_connection_id;
      conn->connection_id = lVar3;
      connc->num_connections = sVar2 + 1;
      connc->next_connection_id = lVar3 + 1;
      CVar8 = CURLE_OK;
    }
  }
  return CVar8;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct conncache *connc,
                                 struct connectdata *conn)
{
  CURLcode result;
  struct connectbundle *bundle;
  struct connectbundle *new_bundle = NULL;
  struct Curl_easy *data = conn->data;

  bundle = Curl_conncache_find_bundle(conn, data->state.conn_cache);
  if(!bundle) {
    char *key;
    int rc;

    result = bundle_create(data, &new_bundle);
    if(result)
      return result;

    key = hashkey(conn);
    if(!key) {
      bundle_destroy(new_bundle);
      return CURLE_OUT_OF_MEMORY;
    }

    rc = conncache_add_bundle(data->state.conn_cache, key, new_bundle);
    free(key);
    if(!rc) {
      bundle_destroy(new_bundle);
      return CURLE_OUT_OF_MEMORY;
    }
    bundle = new_bundle;
  }

  result = bundle_add_conn(bundle, conn);
  if(result) {
    if(new_bundle)
      conncache_remove_bundle(data->state.conn_cache, new_bundle);
    return result;
  }

  conn->connection_id = connc->next_connection_id++;
  connc->num_connections++;

  DEBUGF(infof(conn->data, "Added connection %ld. "
               "The cache now contains %" CURL_FORMAT_CURL_OFF_TU " members\n",
               conn->connection_id, (curl_off_t) connc->num_connections));

  return CURLE_OK;
}